

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O2

int __thiscall ircBot::init(ircBot *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  hostent *phVar2;
  size_t sVar3;
  ssize_t sVar4;
  bool bVar5;
  stringformatter local_870;
  sockaddr_in sa;
  char mybuffer [1000];
  string toserver;
  string join;
  string nick;
  string user;
  
  iVar1 = getvar((char *)0x1574ca);
  if (iVar1 != 0) {
    return iVar1;
  }
  do {
    iVar1 = socket(2,1,6);
    this->sock = iVar1;
    sa.sin_family = 2;
    phVar2 = gethostbyname(irchost);
    sa.sin_addr.s_addr = *(in_addr_t *)*phVar2->h_addr_list;
    sa.sin_port = (ushort)ircport << 8 | (ushort)ircport >> 8;
    this->connected = false;
    connect(this->sock,(sockaddr *)&sa,0x10);
    mybuffer._0_8_ = user;
    stringformatter::operator()((stringformatter *)mybuffer,"USER %s 0 * :%s\r\n",ircbotname);
    iVar1 = this->sock;
    sVar3 = strlen(user);
    send(iVar1,user,sVar3,0);
    mybuffer._0_8_ = nick;
    stringformatter::operator()((stringformatter *)mybuffer,"NICK %s\r\n",ircbotname);
    iVar1 = this->sock;
    sVar3 = strlen(nick);
    send(iVar1,nick,sVar3,0);
    mybuffer._0_8_ = join;
    stringformatter::operator()((stringformatter *)mybuffer,"JOIN %s\r\n",ircchan);
    iVar1 = this->sock;
    sVar3 = strlen(join);
    send(iVar1,join,sVar3,0);
    puts("[ OK ] Initalizing IRC...");
    while( true ) {
      sVar4 = recv(this->sock,(stringformatter *)mybuffer,1000,0);
      ircstring = (int)sVar4;
      bVar5 = this->connected == false;
      if (bVar5) {
        iVar1 = this->sock;
        sVar3 = strlen(join);
        send(iVar1,join,sVar3,0);
      }
      iVar1 = ircstring;
      this->connected = bVar5;
      if (iVar1 == 0) break;
      bVar5 = IsCommand(this,mybuffer);
      if (!bVar5) {
        local_870.buf = toserver;
        stringformatter::operator()
                  (&local_870,"\f7%s \f3%s \f7- \f0%s\f7: %s",irchost,ircchan,&this->msg,
                   (this->msg).message);
        server::sendservmsg(toserver);
      }
      memset((stringformatter *)mybuffer,0,1000);
    }
    this->connected = false;
  } while( true );
}

Assistant:

void ircBot::init()
{
    if(!getvar("ircignore")) {
    init:
        int con;
        char mybuffer[1000];
        
        struct sockaddr_in sa;
        struct hostent *he;
        
        sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        
        sa.sin_family = AF_INET;
        he = gethostbyname(irchost);
        bcopy(*he->h_addr_list, (char *)&sa.sin_addr.s_addr, sizeof(sa.sin_addr.s_addr));
        sa.sin_port = htons(ircport);
        connected = false;
        con = connect(sock, (struct sockaddr *)&sa, sizeof(sa));
        
        defformatstring(user)("USER %s 0 * :%s\r\n", ircbotname, ircbotname);
        send(sock, user, strlen(user), 0);
        defformatstring(nick)("NICK %s\r\n", ircbotname);
        send(sock, nick, strlen(nick), 0);
        defformatstring(join)("JOIN %s\r\n", ircchan);
        send(sock, join, strlen(join), 0);
        
        printf("[ OK ] Initalizing IRC...\n");
        
        
        while(1){
            ircstring = recv(sock, mybuffer, sizeof(mybuffer), 0);
            if(!connected)
            {
                send(sock, join, strlen(join), 0);
                connected = true;
            } else {
                connected = false;
            }
            
            if(ircstring) {
                if(!IsCommand(mybuffer)){
                    
                    defformatstring(toserver)("\f7%s \f3%s \f7- \f0%s\f7: %s", irchost, ircchan, msg.nick, msg.message);
                    server::sendservmsg(toserver);
                    
                }
            } else {
                connected = false;
                break;
            }
            
            memset(mybuffer,'\0',1000);
        }
        connected = false;
        if(!connected) goto init; //re-initalize after excess flood
    }
}